

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::~ChElementHexaCorot_8(ChElementHexaCorot_8 *this,void **vtt)

{
  _func_int **pp_Var1;
  pointer ppCVar2;
  ChGaussPoint *this_00;
  pointer ppCVar3;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChElementHexahedron)._vptr_ChElementHexahedron = pp_Var1;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = (_func_int **)0x1180b20;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0x1180be0;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var1[-3] + -0x48 + (long)(&(this->super_ChElementCorotational).A + -1) + 0x40) =
       vtt[4];
  if (this->ir != (ChGaussIntegrationRule *)0x0) {
    (*this->ir->_vptr_ChGaussIntegrationRule[1])();
  }
  ppCVar2 = (this->GpVector).
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (this->GpVector).
                 super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar2;
      ppCVar3 = ppCVar3 + 1) {
    this_00 = *ppCVar3;
    if (this_00 != (ChGaussPoint *)0x0) {
      ChGaussPoint::~ChGaussPoint(this_00);
    }
    ::operator_delete(this_00,0xa0);
  }
  ppCVar3 = (this->GpVector).
            super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->GpVector).
      super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar3) {
    (this->GpVector).
    super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar3;
  }
  std::_Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::
  ~_Vector_base(&(this->GpVector).
                 super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
               );
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->StiffnessMatrix);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Material).
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::~vector(&this->nodes);
  ChElementGeneric::~ChElementGeneric(&this->super_ChElementGeneric);
  return;
}

Assistant:

ChElementHexaCorot_8::~ChElementHexaCorot_8() {
    delete ir;
    for (auto gpoint : GpVector)
        delete gpoint;
    GpVector.clear();
}